

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O1

bool __thiscall
duckdb::StringValueScanner::SkipUntilState
          (StringValueScanner *this,CSVState initial_state,CSVState until_state,
          CSVIterator *current_iterator,bool *quoted)

{
  shared_ptr<duckdb::CSVStateMachine,_true> *this_00;
  CSVState CVar1;
  char cVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t iVar8;
  uint uVar9;
  char cVar10;
  CSVStateMachine *pCVar11;
  idx_t iVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  
  uVar14 = (ulong)initial_state;
  uVar3 = (current_iterator->boundary).end_pos;
  this_00 = &this->state_machine_strict;
  bVar15 = true;
  do {
    cVar10 = (char)uVar14;
    if (uVar3 <= (current_iterator->pos).buffer_pos) {
      return false;
    }
    pCVar11 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    pcVar4 = (this->super_BaseScanner).buffer_handle_ptr;
    iVar12 = (current_iterator->pos).buffer_pos;
    (current_iterator->pos).buffer_pos = iVar12 + 1;
    CVar1 = pCVar11->transition_array->state_machine[(byte)pcVar4[iVar12]][uVar14];
    uVar14 = (ulong)CVar1;
    switch(uVar14) {
    case 0:
switchD_01511a79_caseD_0:
      iVar12 = (current_iterator->pos).buffer_pos;
      uVar13 = iVar12 + 8;
      while (uVar13 < uVar3) {
        uVar13 = *(ulong *)((this->super_BaseScanner).buffer_handle_ptr + iVar12);
        pCVar11 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar5 = pCVar11->transition_array->delimiter;
        pCVar11 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar6 = pCVar11->transition_array->new_line;
        pCVar11 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar7 = pCVar11->transition_array->carriage_return;
        pCVar11 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar13 = (uVar13 ^ pCVar11->transition_array->comment) & (uVar7 ^ uVar13) &
                 (uVar6 ^ uVar13) & (uVar5 ^ uVar13);
        if ((~(0x101010101010100 - uVar13 | uVar13) & 0x8080808080808080) != 0) break;
        iVar8 = (current_iterator->pos).buffer_pos;
        iVar12 = iVar8 + 8;
        (current_iterator->pos).buffer_pos = iVar12;
        uVar13 = iVar8 + 0x10;
      }
      pCVar11 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      iVar12 = (current_iterator->pos).buffer_pos;
      while ((iVar12 < uVar3 - 1 &&
             (pCVar11->transition_array->skip_standard
              [(byte)(this->super_BaseScanner).buffer_handle_ptr[iVar12]] != false))) {
        (current_iterator->pos).buffer_pos = iVar12 + 1;
        pCVar11 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        iVar12 = (current_iterator->pos).buffer_pos;
      }
      uVar9 = (uint)CVar1;
      if ((uVar9 - 5 < 2) || (uVar9 == 1)) goto switchD_01511a79_caseD_1;
      if (uVar9 == 7) goto switchD_01511a79_caseD_7;
      break;
    case 1:
    case 5:
    case 6:
switchD_01511a79_caseD_1:
      if ((bVar15) &&
         (cVar2 = (this->super_BaseScanner).buffer_handle_ptr
                  [(current_iterator->pos).buffer_pos - 1],
         pCVar11 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00),
         cVar2 == (pCVar11->dialect_options).state_machine_options.quote.value)) {
        *quoted = true;
      }
      break;
    case 2:
    case 3:
    case 4:
      break;
    case 7:
switchD_01511a79_caseD_7:
      iVar12 = (current_iterator->pos).buffer_pos;
      uVar13 = iVar12 + 8;
      while (uVar13 < uVar3) {
        uVar13 = *(ulong *)((this->super_BaseScanner).buffer_handle_ptr + iVar12);
        pCVar11 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar5 = pCVar11->transition_array->quote;
        pCVar11 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar13 = (uVar13 ^ pCVar11->transition_array->escape) & (uVar5 ^ uVar13);
        if ((~(0x101010101010100 - uVar13 | uVar13) & 0x8080808080808080) != 0) break;
        iVar8 = (current_iterator->pos).buffer_pos;
        iVar12 = iVar8 + 8;
        (current_iterator->pos).buffer_pos = iVar12;
        uVar13 = iVar8 + 0x10;
      }
      pCVar11 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      iVar12 = (current_iterator->pos).buffer_pos;
      while ((iVar12 < uVar3 - 1 &&
             (pCVar11->transition_array->skip_quoted
              [(byte)(this->super_BaseScanner).buffer_handle_ptr[iVar12]] != false))) {
        (current_iterator->pos).buffer_pos = iVar12 + 1;
        pCVar11 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        iVar12 = (current_iterator->pos).buffer_pos;
      }
      if ((CVar1 < 7) && ((0x62U >> (CVar1 & 0x1f) & 1) != 0)) goto switchD_01511a79_caseD_1;
      break;
    default:
      if (CVar1 == STANDARD_NEWLINE) goto switchD_01511a79_caseD_0;
    }
    if (CVar1 == until_state) {
      return true;
    }
    if (cVar10 == '\x01') {
      bVar15 = false;
    }
    if (CVar1 == INVALID) {
      return false;
    }
  } while( true );
}

Assistant:

bool StringValueScanner::SkipUntilState(CSVState initial_state, CSVState until_state, CSVIterator &current_iterator,
                                        bool &quoted) const {
	CSVStates current_state;
	current_state.Initialize(initial_state);
	bool first_column = true;
	const idx_t to_pos = current_iterator.GetEndPos();
	while (current_iterator.pos.buffer_pos < to_pos) {
		state_machine_strict->Transition(current_state, buffer_handle_ptr[current_iterator.pos.buffer_pos++]);
		if (current_state.IsState(CSVState::STANDARD) || current_state.IsState(CSVState::STANDARD_NEWLINE)) {
			while (current_iterator.pos.buffer_pos + 8 < to_pos) {
				uint64_t value = Load<uint64_t>(
				    reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[current_iterator.pos.buffer_pos]));
				if (ContainsZeroByte((value ^ state_machine_strict->transition_array.delimiter) &
				                     (value ^ state_machine_strict->transition_array.new_line) &
				                     (value ^ state_machine_strict->transition_array.carriage_return) &
				                     (value ^ state_machine_strict->transition_array.comment))) {
					break;
				}
				current_iterator.pos.buffer_pos += 8;
			}
			while (state_machine_strict->transition_array
			           .skip_standard[static_cast<uint8_t>(buffer_handle_ptr[current_iterator.pos.buffer_pos])] &&
			       current_iterator.pos.buffer_pos < to_pos - 1) {
				current_iterator.pos.buffer_pos++;
			}
		}
		if (current_state.IsState(CSVState::QUOTED)) {
			while (current_iterator.pos.buffer_pos + 8 < to_pos) {
				uint64_t value = Load<uint64_t>(
				    reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[current_iterator.pos.buffer_pos]));
				if (ContainsZeroByte((value ^ state_machine_strict->transition_array.quote) &
				                     (value ^ state_machine_strict->transition_array.escape))) {
					break;
				}
				current_iterator.pos.buffer_pos += 8;
			}

			while (state_machine_strict->transition_array
			           .skip_quoted[static_cast<uint8_t>(buffer_handle_ptr[current_iterator.pos.buffer_pos])] &&
			       current_iterator.pos.buffer_pos < to_pos - 1) {
				current_iterator.pos.buffer_pos++;
			}
		}
		if ((current_state.IsState(CSVState::DELIMITER) || current_state.IsState(CSVState::CARRIAGE_RETURN) ||
		     current_state.IsState(CSVState::RECORD_SEPARATOR)) &&
		    first_column) {
			if (buffer_handle_ptr[current_iterator.pos.buffer_pos - 1] ==
			    state_machine_strict->dialect_options.state_machine_options.quote.GetValue()) {
				quoted = true;
			}
		}
		if (current_state.WasState(CSVState::DELIMITER)) {
			first_column = false;
		}
		if (current_state.IsState(until_state)) {
			return true;
		}
		if (current_state.IsState(CSVState::INVALID)) {
			return false;
		}
	}
	return false;
}